

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance> *this,
          Context *context)

{
  Context **this_00;
  Context **this_01;
  deInt32 *pdVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  int iVar4;
  Context *pCVar5;
  uint uVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  TestInstance *pTVar9;
  TextureFormat this_02;
  long lVar10;
  ulong uVar11;
  _func_int **pp_Var12;
  Context *pCVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  int levelNdx;
  int iVar18;
  _func_int **pp_Var19;
  uint uVar20;
  Context *pCVar21;
  long lVar22;
  bool bVar23;
  float fVar24;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar25;
  float fVar26;
  float fVar27;
  deUint32 step;
  RGBA local_120;
  RGBA local_11c;
  undefined8 local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  Vec4 local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 uStack_d8;
  int local_d0;
  int local_cc;
  void *local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  uint local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  int local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined8 local_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  Vec4 local_48;
  
  pTVar9 = (TestInstance *)operator_new(0x288);
  pTVar9->m_context = context;
  pTVar9->_vptr_TestInstance = (_func_int **)&PTR__Texture2DShadowTestInstance_00d03ea0;
  pTVar9[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar9[1].m_context;
  this_01 = &pTVar9[4].m_context;
  pTVar9[1].m_context = (Context *)0x0;
  pTVar9[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar9[2].m_context = (Context *)0x0;
  pTVar9[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar9[3].m_context = (Context *)0x0;
  pTVar9[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            ((TextureRenderer *)this_01,context,
             (this->m_testsParameters).super_Texture2DTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,0x40,0x40);
  *(undefined4 *)&pTVar9[0x28]._vptr_TestInstance = 0;
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
             *)this_00,2);
  bVar23 = true;
  do {
    bVar17 = bVar23;
    this_02 = (TextureFormat)operator_new(0x70);
    local_f8.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar9[1]._vptr_TestInstance + 3));
    pipeline::TestTexture2D::TestTexture2D
              ((TestTexture2D *)this_02,(TextureFormat *)&local_f8,
               *(int *)(pTVar9[1]._vptr_TestInstance + 7),
               *(int *)((long)pTVar9[1]._vptr_TestInstance + 0x3c));
    local_e0 = (SharedPtrStateBase *)0x0;
    local_e8 = (undefined1  [8])this_02;
    local_e0 = (SharedPtrStateBase *)operator_new(0x20);
    local_e0->strongRefCount = 0;
    local_e0->weakRefCount = 0;
    local_e0->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d02fe0;
    local_e0[1]._vptr_SharedPtrStateBase = (_func_int **)this_02;
    local_e0->strongRefCount = 1;
    local_e0->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTexture2D>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTexture2D> *)local_e8);
    if (local_e0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &local_e0->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_e8._0_4_ = R;
        local_e8._4_4_ = SNORM_INT8;
        (*local_e0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &local_e0->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_e0 != (SharedPtrStateBase *)0x0)) {
        (*local_e0->_vptr_SharedPtrStateBase[1])();
      }
    }
    bVar23 = false;
  } while (bVar17);
  uVar6 = (*(code *)(*this_00)->m_testCtx->m_platform[2]._vptr_Platform)();
  if (0 < (int)uVar6) {
    uVar20 = 0;
    do {
      (*(code *)(*this_00)->m_testCtx->m_platform[7]._vptr_Platform)
                ((PixelBufferAccess *)local_e8,(*this_00)->m_testCtx,uVar20,0);
      local_f8.m_data[0] = -0.5;
      local_f8.m_data[1] = -0.5;
      local_f8.m_data[2] = -0.5;
      local_f8.m_data[3] = 2.0;
      local_48.m_data[0] = 1.0;
      local_48.m_data[1] = 1.0;
      local_48.m_data[2] = 1.0;
      local_48.m_data[3] = 0.0;
      tcu::fillWithComponentGradients((PixelBufferAccess *)local_e8,&local_f8,&local_48);
      uVar20 = uVar20 + 1;
    } while (uVar6 != uVar20);
    uVar20 = 0;
    local_108 = (float)(0xffffff / (ulong)uVar6);
    do {
      (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x38))
                ((PixelBufferAccess *)local_e8,(*this_00)->m_progCollection,uVar20,0);
      uVar15 = uVar20 * (int)local_108;
      local_11c.m_value = uVar15 | 0xff000000;
      tcu::RGBA::toVec(&local_11c);
      local_120.m_value = ~uVar15 | 0xff000000;
      tcu::RGBA::toVec(&local_120);
      tcu::fillWithGrid((PixelBufferAccess *)local_e8,4,&local_f8,&local_48);
      uVar20 = uVar20 + 1;
    } while (uVar6 != uVar20);
  }
  for (pCVar21 = pTVar9[1].m_context; pCVar21 != (Context *)pTVar9[2]._vptr_TestInstance;
      pCVar21 = (Context *)&pCVar21->m_progCollection) {
    TextureRenderer::add2DTexture((TextureRenderer *)this_01,(TestTexture2DSp *)pCVar21);
  }
  local_cc = 0;
  bVar23 = *(int *)(pTVar9[1]._vptr_TestInstance + 8) - 5U < 2;
  if (!bVar23) {
    local_cc = 0x3f000000;
  }
  local_e8 = (undefined1  [8])((ulong)*(uint *)(&DAT_00b29870 + (ulong)bVar23 * 4) << 0x20);
  local_e0 = (SharedPtrStateBase *)0x4039999a3fcccccd;
  uStack_d8._0_4_ = -0x40800000;
  uStack_d8._4_4_ = -0x3fd33333;
  local_d0 = 0;
  local_c8 = (void *)0xbfaccccdc0000000;
  uStack_c0 = 0x3f333333be4ccccd;
  local_b8 = 1;
  local_b4 = *(uint *)(&DAT_00b29870 + (ulong)bVar23 * 4);
  local_b0 = 0x3e8ccccd3e0f5c29;
  uStack_a8 = 0xbf8ccccdbfc00000;
  local_a0 = 1;
  local_9c = local_cc;
  local_98 = 0xc028f5c3bf6b851f;
  uStack_90 = 0xbdcccccd3ecccccd;
  local_88 = 1;
  local_84 = 0xbec7ae143f8ccccd;
  uStack_7c = 0x3f266666bf051eb8;
  local_74 = 0x13f5eb852;
  local_6c = 0xbfc66666bdcccccd;
  uStack_64 = 0x3eb333333f266666;
  local_5c = 0x3f68f5c3;
  lVar22 = 0;
  do {
    iVar4 = *(int *)(local_e8 + lVar22 * 0x18);
    iVar18 = (int)((ulong)((long)pTVar9[2]._vptr_TestInstance - (long)pTVar9[1].m_context) >> 4) +
             -1;
    if (iVar4 < iVar18) {
      iVar18 = iVar4;
    }
    if (iVar4 < 0) {
      iVar18 = 0;
    }
    uVar3 = *(undefined4 *)(local_e8 + lVar22 * 0x18 + 4);
    local_118 = CONCAT44(local_118._4_4_,*(undefined4 *)((long)&local_e0 + lVar22 * 0x18 + 4));
    local_58 = (&uStack_d8)[lVar22 * 3];
    uStack_50 = 0;
    local_108 = expf(*(float *)(&local_e0 + lVar22 * 3) * 0.6931472);
    fStack_104 = extraout_XMM0_Db;
    fStack_100 = extraout_XMM0_Dc;
    fStack_fc = extraout_XMM0_Dd;
    dVar7 = TextureRenderer::getRenderWidth((TextureRenderer *)this_01);
    lVar10 = (*(code *)(&(*this_00)->m_testCtx)[(long)iVar18 * 2]->m_platform[0x11]._vptr_Platform)
                       ();
    iVar4 = *(int *)(lVar10 + 0x38);
    fVar24 = expf((float)local_118 * 0.6931472);
    local_118 = CONCAT44(extraout_XMM0_Db_00,fVar24);
    dVar8 = TextureRenderer::getRenderHeight((TextureRenderer *)this_01);
    lVar10 = (*(code *)(&(*this_00)->m_testCtx)[(long)iVar18 * 2]->m_platform[0x11]._vptr_Platform)
                       ();
    fVar24 = (local_108 * (float)dVar7) / (float)iVar4 + (float)local_58;
    fVar25 = ((float)local_118 * (float)dVar8) / (float)*(int *)(lVar10 + 0x3c) + local_58._4_4_;
    fVar26 = fStack_104 + (float)uStack_50;
    fVar27 = local_118._4_4_ + uStack_50._4_4_;
    pCVar21 = pTVar9[3].m_context;
    if (pCVar21 == (Context *)pTVar9[4]._vptr_TestInstance) {
      pCVar5 = (Context *)pTVar9[3]._vptr_TestInstance;
      lVar10 = (long)pCVar21 - (long)pCVar5;
      local_118 = lVar22;
      local_108 = fVar24;
      fStack_104 = fVar25;
      fStack_100 = fVar26;
      fStack_fc = fVar27;
      if (lVar10 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar11 = (lVar10 >> 3) * -0x5555555555555555;
      uVar14 = uVar11;
      if (pCVar21 == pCVar5) {
        uVar14 = 1;
      }
      uVar16 = uVar14 + uVar11;
      if (0x555555555555554 < uVar16) {
        uVar16 = 0x555555555555555;
      }
      if (CARRY8(uVar14,uVar11)) {
        uVar16 = 0x555555555555555;
      }
      pp_Var12 = (_func_int **)operator_new(uVar16 * 0x18);
      lVar22 = local_118;
      *(int *)((long)pp_Var12 + lVar10) = iVar18;
      puVar2 = (undefined4 *)((long)pp_Var12 + lVar10 + 4);
      *puVar2 = (float)local_58;
      puVar2[1] = local_58._4_4_;
      puVar2[2] = local_108;
      puVar2[3] = fStack_104;
      *(undefined4 *)((long)pp_Var12 + lVar10 + 0x14) = uVar3;
      pp_Var19 = pp_Var12;
      for (pCVar13 = pCVar5; pCVar21 != pCVar13; pCVar13 = (Context *)&pCVar13->m_device) {
        *(undefined4 *)pp_Var19 = *(undefined4 *)&pCVar13->m_testCtx;
        *(undefined4 *)((long)pp_Var19 + 4) = *(undefined4 *)((long)&pCVar13->m_testCtx + 4);
        *(undefined4 *)(pp_Var19 + 1) = *(undefined4 *)&pCVar13->m_platformInterface;
        *(undefined4 *)((long)pp_Var19 + 0xc) =
             *(undefined4 *)((long)&pCVar13->m_platformInterface + 4);
        *(undefined4 *)(pp_Var19 + 2) = *(undefined4 *)&pCVar13->m_progCollection;
        *(undefined4 *)((long)pp_Var19 + 0x14) =
             *(undefined4 *)((long)&pCVar13->m_progCollection + 4);
        pp_Var19 = pp_Var19 + 3;
      }
      if (pCVar5 != (Context *)0x0) {
        operator_delete(pCVar5,(long)pTVar9[4]._vptr_TestInstance - (long)pCVar5);
      }
      pTVar9[3]._vptr_TestInstance = pp_Var12;
      pTVar9[3].m_context = (Context *)(pp_Var19 + 3);
      pTVar9[4]._vptr_TestInstance = pp_Var12 + uVar16 * 3;
    }
    else {
      *(int *)&pCVar21->m_testCtx = iVar18;
      *(float *)((long)&pCVar21->m_testCtx + 4) = (float)local_58;
      *(float *)&pCVar21->m_platformInterface = local_58._4_4_;
      *(float *)((long)&pCVar21->m_platformInterface + 4) = fVar24;
      *(float *)&pCVar21->m_progCollection = fVar25;
      *(undefined4 *)((long)&pCVar21->m_progCollection + 4) = uVar3;
      pTVar9[3].m_context = (Context *)&pCVar21->m_device;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 6);
  *(undefined4 *)&pTVar9[0x28]._vptr_TestInstance = 0;
  return pTVar9;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}